

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::handleSwitchAttributes
          (HlslParseContext *this,TSourceLoc *loc,TIntermSwitch *selection,TAttributes *attributes)

{
  _List_node_base *p_Var1;
  
  if (selection != (TIntermSwitch *)0x0) {
    for (p_Var1 = (attributes->
                  super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                  ).
                  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        (_List_node_header *)p_Var1 !=
        &(attributes->
         super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>).
         super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
         ._M_impl._M_node; p_Var1 = p_Var1->_M_next) {
      if (*(int *)&p_Var1[1]._M_next == 2) {
        selection->dontFlatten = true;
      }
      else if (*(int *)&p_Var1[1]._M_next == 7) {
        selection->flatten = true;
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                  (this,loc,"attribute does not apply to a switch","","");
      }
    }
  }
  return;
}

Assistant:

void HlslParseContext::handleSwitchAttributes(const TSourceLoc& loc, TIntermSwitch* selection,
    const TAttributes& attributes)
{
    if (selection == nullptr)
        return;

    for (auto it = attributes.begin(); it != attributes.end(); ++it) {
        switch (it->name) {
        case EatFlatten:
            selection->setFlatten();
            break;
        case EatBranch:
            selection->setDontFlatten();
            break;
        default:
            warn(loc, "attribute does not apply to a switch", "", "");
            break;
        }
    }
}